

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O3

int printHelp(int argc,char **argv)

{
  FILE *__stream;
  char *pcVar1;
  
  fprintf(_stderr,
          "Usage: %s [-options] [file_name]\n\nRead the files specified and\ncreate a binary file [package-name]_[bundle-name].spp with the StringPrep profile data\n\n"
          ,argv);
  fwrite("Options:\n\t-h or -? or --help       print this usage text\n\t-v or --verbose          verbose output\n\t-c or --copyright        include a copyright notice\n"
         ,0x97,1,_stderr);
  __stream = _stderr;
  pcVar1 = u_getDataDirectory_63();
  fprintf(__stream,
          "\t-d or --destdir          destination directory, followed by the path\n\t-s or --sourcedir        source directory of ICU data, followed by the path\n\t-b or --bundle-name      generate the output data file with the name specified\n\t-i or --icudatadir       directory for locating any needed intermediate data files,\n\t                         followed by path, defaults to %s\n"
          ,pcVar1);
  fwrite("\t-n or --normalize        turn on the option for normalization and include mappings\n\t                         from NormalizationCorrections.txt from the given path,\n\t                         e.g: /test/icu/source/data/unidata\n"
         ,0xe2,1,_stderr);
  fwrite("\t-m or --norm-correction  use NormalizationCorrections.txt from the given path\n\t                         when the input file contains a normalization directive.\n\t                         unlike -n/--normalize, this option does not force the\n\t                         normalization.\n"
         ,0x11a,1,_stderr);
  fwrite("\t-k or --check-bidi       turn on the option for checking for BiDi in the profile\n\t-u or --unicode          version of Unicode to be used with this profile followed by the version\n"
         ,0xb4,1,_stderr);
  return (uint)argc >> 0x1f;
}

Assistant:

static int printHelp(int argc, char* argv[]){
    /*
     * Broken into chucks because the C89 standard says the minimum
     * required supported string length is 509 bytes.
     */
    fprintf(stderr,
        "Usage: %s [-options] [file_name]\n"
        "\n"
        "Read the files specified and\n"
        "create a binary file [package-name]_[bundle-name]." DATA_TYPE " with the StringPrep profile data\n"
        "\n",
        argv[0]);
    fprintf(stderr,
        "Options:\n"
        "\t-h or -? or --help       print this usage text\n"
        "\t-v or --verbose          verbose output\n"
        "\t-c or --copyright        include a copyright notice\n");
    fprintf(stderr,
        "\t-d or --destdir          destination directory, followed by the path\n"
        "\t-s or --sourcedir        source directory of ICU data, followed by the path\n"
        "\t-b or --bundle-name      generate the output data file with the name specified\n"
        "\t-i or --icudatadir       directory for locating any needed intermediate data files,\n"
        "\t                         followed by path, defaults to %s\n",
        u_getDataDirectory());
    fprintf(stderr,
        "\t-n or --normalize        turn on the option for normalization and include mappings\n"
        "\t                         from NormalizationCorrections.txt from the given path,\n"
        "\t                         e.g: /test/icu/source/data/unidata\n");
    fprintf(stderr,
        "\t-m or --norm-correction  use NormalizationCorrections.txt from the given path\n"
        "\t                         when the input file contains a normalization directive.\n"
        "\t                         unlike -n/--normalize, this option does not force the\n"
        "\t                         normalization.\n");
    fprintf(stderr,
        "\t-k or --check-bidi       turn on the option for checking for BiDi in the profile\n"
        "\t-u or --unicode          version of Unicode to be used with this profile followed by the version\n"
        );
    return argc<0 ? U_ILLEGAL_ARGUMENT_ERROR : U_ZERO_ERROR;
}